

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall
pbrt::BasicSceneBuilder::MediumInterface
          (BasicSceneBuilder *this,string *origInsideName,string *origOutsideName,FileLoc loc)

{
  string *in_RDX;
  string *in_RSI;
  long in_RDI;
  string outsideName;
  string insideName;
  string local_a8 [32];
  string local_88 [48];
  string local_58 [32];
  string local_38 [16];
  string *in_stack_ffffffffffffffd8;
  
  std::__cxx11::string::string(local_58,in_RSI);
  NormalizeUTF8(in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::string(local_a8,in_RDX);
  NormalizeUTF8(in_stack_ffffffffffffffd8);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x20),local_38);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x40),local_88);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void BasicSceneBuilder::MediumInterface(const std::string &origInsideName,
                                        const std::string &origOutsideName, FileLoc loc) {
    std::string insideName = NormalizeUTF8(origInsideName);
    std::string outsideName = NormalizeUTF8(origOutsideName);

    graphicsState.currentInsideMedium = insideName;
    graphicsState.currentOutsideMedium = outsideName;
}